

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRackpinion.cpp
# Opt level: O1

void __thiscall
chrono::ChLinkRackpinion::ChLinkRackpinion(ChLinkRackpinion *this,ChLinkRackpinion *other)

{
  ChQuaternion<double> local_40;
  
  ChLinkMateGeneric::ChLinkMateGeneric
            (&this->super_ChLinkMateGeneric,&other->super_ChLinkMateGeneric);
  (this->super_ChLinkMateGeneric).super_ChLinkMate.super_ChLink.super_ChLinkBase.super_ChPhysicsItem
  .super_ChObj._vptr_ChObj = (_func_int **)&PTR__ChLinkRackpinion_00b44ed0;
  (this->contact_pt).m_data[0] = 0.0;
  (this->contact_pt).m_data[1] = 0.0;
  (this->contact_pt).m_data[2] = 0.0;
  local_40.m_data[0] = 1.0;
  local_40.m_data[1] = 0.0;
  local_40.m_data[2] = 0.0;
  local_40.m_data[3] = 0.0;
  (this->local_pinion)._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b2b308;
  (this->local_pinion).coord.pos.m_data[0] = 0.0;
  (this->local_pinion).coord.pos.m_data[1] = 0.0;
  (this->local_pinion).coord.pos.m_data[2] = 0.0;
  (this->local_pinion).coord.rot.m_data[0] = 1.0;
  (this->local_pinion).coord.rot.m_data[1] = 0.0;
  (this->local_pinion).coord.rot.m_data[2] = 0.0;
  (this->local_pinion).coord.rot.m_data[3] = 0.0;
  ChMatrix33<double>::ChMatrix33(&(this->local_pinion).Amatrix,&local_40);
  local_40.m_data[0] = 1.0;
  local_40.m_data[1] = 0.0;
  local_40.m_data[2] = 0.0;
  local_40.m_data[3] = 0.0;
  (this->local_rack)._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b2b308;
  (this->local_rack).coord.pos.m_data[0] = 0.0;
  (this->local_rack).coord.pos.m_data[1] = 0.0;
  (this->local_rack).coord.pos.m_data[2] = 0.0;
  (this->local_rack).coord.rot.m_data[0] = 1.0;
  (this->local_rack).coord.rot.m_data[1] = 0.0;
  (this->local_rack).coord.rot.m_data[2] = 0.0;
  (this->local_rack).coord.rot.m_data[3] = 0.0;
  ChMatrix33<double>::ChMatrix33(&(this->local_rack).Amatrix,&local_40);
  this->R = other->R;
  this->alpha = other->alpha;
  this->beta = other->beta;
  this->phase = other->phase;
  this->a1 = other->a1;
  this->checkphase = other->checkphase;
  if (other != this) {
    (this->contact_pt).m_data[0] = (other->contact_pt).m_data[0];
    (this->contact_pt).m_data[1] = (other->contact_pt).m_data[1];
    (this->contact_pt).m_data[2] = (other->contact_pt).m_data[2];
  }
  ChFrame<double>::operator=(&this->local_pinion,&other->local_pinion);
  ChFrame<double>::operator=(&this->local_rack,&other->local_rack);
  return;
}

Assistant:

ChLinkRackpinion::ChLinkRackpinion(const ChLinkRackpinion& other) : ChLinkMateGeneric(other) {
    R = other.R;
    alpha = other.alpha;
    beta = other.beta;
    phase = other.phase;
    a1 = other.a1;
    checkphase = other.checkphase;

    contact_pt = other.contact_pt;
    local_pinion = other.local_pinion;
    local_rack = other.local_rack;
}